

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

void Curl_resolv_unlock(SessionHandle *data,Curl_dns_entry *dns)

{
  long *plVar1;
  Curl_dns_entry *dns_1;
  
  if (data == (SessionHandle *)0x0) {
    plVar1 = &dns->inuse;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      Curl_freeaddrinfo(dns->addr);
      (*Curl_cfree)(dns);
      return;
    }
  }
  else {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    plVar1 = &dns->inuse;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      Curl_freeaddrinfo(dns->addr);
      (*Curl_cfree)(dns);
    }
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      return;
    }
  }
  return;
}

Assistant:

void Curl_resolv_unlock(struct SessionHandle *data, struct Curl_dns_entry *dns)
{
  if(data && data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  freednsentry(dns);

  if(data && data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
}